

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

LogicalCountExpr __thiscall
mp::BasicExprFactory<std::allocator<char>>::
MakeBinary<mp::LogicalCountExpr,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,
          BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> lhs,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>
          rhs)

{
  Impl *pIVar1;
  LogicalCountExpr LVar2;
  Impl *in_RCX;
  BasicExprFactory<std::allocator<char>_> *in_RDX;
  Impl *impl;
  Impl *in_stack_ffffffffffffffc8;
  
  pIVar1 = BasicExprFactory<std::allocator<char>_>::Allocate<mp::LogicalCountExpr>
                     (in_RDX,(Kind)((ulong)in_RCX >> 0x20),(int)in_RCX);
  pIVar1->lhs = (Impl *)in_RDX;
  pIVar1->rhs = in_RCX;
  LVar2 = internal::ExprBase::Create<mp::LogicalCountExpr>(in_stack_ffffffffffffffc8);
  return (BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>)
         LVar2.super_BasicExpr<(mp::expr::Kind)59,_(mp::expr::Kind)64>.super_ExprBase.impl_;
}

Assistant:

ExprType MakeBinary(expr::Kind kind, LHS lhs, RHS rhs) {
    MP_ASSERT(internal::Is<ExprType>(kind), "invalid expression kind");
    MP_ASSERT(lhs != 0 && rhs != 0, "invalid argument");
    typename ExprType::Impl *impl = Allocate<ExprType>(kind);
    impl->lhs = lhs.impl_;
    impl->rhs = rhs.impl_;
    return Expr::Create<ExprType>(impl);
  }